

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enable_shared_from_this_ipp.hpp
# Opt level: O0

shared_ptr<duckdb::Event,_true> __thiscall
duckdb::enable_shared_from_this<duckdb::Event>::shared_from_this
          (enable_shared_from_this<duckdb::Event> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<duckdb::Event,_true> sVar1;
  element_type *this_00;
  
  this_00 = in_RDI;
  weak_ptr<duckdb::Event,_true>::weak_ptr
            ((weak_ptr<duckdb::Event,_true> *)in_RDI,(weak_ptr<duckdb::Event,_true> *)in_RDI);
  shared_ptr<duckdb::Event,_true>::shared_ptr<duckdb::Event>
            ((shared_ptr<duckdb::Event,_true> *)this_00,(weak_ptr<duckdb::Event,_true> *)in_RDI);
  weak_ptr<duckdb::Event,_true>::~weak_ptr((weak_ptr<duckdb::Event,_true> *)0x9a0a19);
  sVar1.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<duckdb::Event,_true>)
         sVar1.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> shared_from_this() { // NOLINT: invalid case style
		return shared_ptr<T>(__weak_this_);
	}